

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O0

void CmdCommandPrint(Abc_Frame_t *pAbc,int fPrintAll,int fDetails)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  Abc_Command **ppC1;
  st__generator *gen_00;
  size_t sVar4;
  char *pcVar5;
  char *tmp_cmd_1;
  char *tmp_cmd;
  FILE *backupErr;
  int iCom;
  int nColumns;
  int LenghtMax;
  char *sGroupCur;
  int j;
  int i;
  int iGroupStart;
  int nCommands;
  Abc_Command *pCommands;
  Abc_Command **ppCommands;
  st__generator *gen;
  char *value;
  char *key;
  int fDetails_local;
  int fPrintAll_local;
  Abc_Frame_t *pAbc_local;
  
  backupErr._4_4_ = 0;
  pFVar1 = pAbc->Err;
  key._0_4_ = fDetails;
  key._4_4_ = fPrintAll;
  _fDetails_local = pAbc;
  ppC1 = (Abc_Command **)malloc((long)pAbc->tCommands->num_entries << 3);
  sGroupCur._4_4_ = 0;
  gen_00 = st__init_gen(_fDetails_local->tCommands);
  while (iVar2 = sGroupCur._4_4_, iVar3 = st__gen(gen_00,&value,(char **)&gen), iVar3 != 0) {
    if ((key._4_4_ != 0) || (*(char *)&gen->table->compare != '_')) {
      ppC1[sGroupCur._4_4_] = (Abc_Command *)gen;
      sGroupCur._4_4_ = sGroupCur._4_4_ + 1;
    }
  }
  st__free_gen(gen_00);
  qsort(ppC1,(long)sGroupCur._4_4_,8,CmdCommandPrintCompare);
  iVar3 = CmdCommandPrintCompare(ppC1,ppC1 + (long)sGroupCur._4_4_ + -1);
  if (0 < iVar3) {
    __assert_fail("CmdCommandPrintCompare( ppCommands, ppCommands + nCommands - 1 ) <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cmd/cmdUtils.c"
                  ,0x245,"void CmdCommandPrint(Abc_Frame_t *, int, int)");
  }
  iCom = 0;
  for (sGroupCur._4_4_ = 0; sGroupCur._4_4_ < iVar2; sGroupCur._4_4_ = sGroupCur._4_4_ + 1) {
    sVar4 = strlen(ppC1[sGroupCur._4_4_]->sName);
    if (iCom < (int)sVar4) {
      sVar4 = strlen(ppC1[sGroupCur._4_4_]->sName);
      iCom = (int)sVar4;
    }
  }
  fprintf((FILE *)_fDetails_local->Out,"      Welcome to ABC compiled on %s %s!","May  2 2025",
          "14:33:42");
  _nColumns = (char *)0x0;
  j = 0;
  _fDetails_local->Err = _fDetails_local->Out;
  for (sGroupCur._4_4_ = 0; sGroupCur._4_4_ < iVar2; sGroupCur._4_4_ = sGroupCur._4_4_ + 1) {
    if ((_nColumns == (char *)0x0) ||
       (iVar3 = strcmp(_nColumns,ppC1[sGroupCur._4_4_]->sGroup), iVar3 != 0)) {
      if (((int)key != 0) && (sGroupCur._4_4_ != j)) {
        fprintf((FILE *)_fDetails_local->Out,"\n");
        for (sGroupCur._0_4_ = j; (int)sGroupCur < sGroupCur._4_4_;
            sGroupCur._0_4_ = (int)sGroupCur + 1) {
          fprintf((FILE *)_fDetails_local->Out,"\n");
          sVar4 = strlen(ppC1[(int)sGroupCur]->sName);
          pcVar5 = (char *)malloc(sVar4 + 4);
          sprintf(pcVar5,"%s -h",ppC1[(int)sGroupCur]->sName);
          Cmd_CommandExecute(_fDetails_local,pcVar5);
          if (pcVar5 != (char *)0x0) {
            free(pcVar5);
          }
        }
        fprintf((FILE *)_fDetails_local->Out,"\n");
        fprintf((FILE *)_fDetails_local->Out,
                "   ----------------------------------------------------------------------");
        j = sGroupCur._4_4_;
      }
      fprintf((FILE *)_fDetails_local->Out,"\n");
      fprintf((FILE *)_fDetails_local->Out,"\n");
      fprintf((FILE *)_fDetails_local->Out,"%s commands:\n",ppC1[sGroupCur._4_4_]->sGroup);
      fprintf((FILE *)_fDetails_local->Out," %-*s",(ulong)(uint)iCom,ppC1[sGroupCur._4_4_]->sName);
      _nColumns = ppC1[sGroupCur._4_4_]->sGroup;
      backupErr._4_4_ = 1;
    }
    else {
      if (backupErr._4_4_ % (int)(0x4f / (long)(iCom + 2)) == 0) {
        fprintf((FILE *)_fDetails_local->Out,"\n");
      }
      fprintf((FILE *)_fDetails_local->Out," %-*s",(ulong)(uint)iCom,ppC1[sGroupCur._4_4_]->sName);
      backupErr._4_4_ = backupErr._4_4_ + 1;
    }
  }
  if (((int)key != 0) && (sGroupCur._4_4_ != j)) {
    fprintf((FILE *)_fDetails_local->Out,"\n");
    for (sGroupCur._0_4_ = j; (int)sGroupCur < sGroupCur._4_4_; sGroupCur._0_4_ = (int)sGroupCur + 1
        ) {
      fprintf((FILE *)_fDetails_local->Out,"\n");
      sVar4 = strlen(ppC1[(int)sGroupCur]->sName);
      pcVar5 = (char *)malloc(sVar4 + 4);
      sprintf(pcVar5,"%s -h",ppC1[(int)sGroupCur]->sName);
      Cmd_CommandExecute(_fDetails_local,pcVar5);
      if (pcVar5 != (char *)0x0) {
        free(pcVar5);
      }
    }
  }
  _fDetails_local->Err = pFVar1;
  fprintf((FILE *)_fDetails_local->Out,"\n");
  if (ppC1 != (Abc_Command **)0x0) {
    free(ppC1);
  }
  return;
}

Assistant:

void CmdCommandPrint( Abc_Frame_t * pAbc, int fPrintAll, int fDetails )
{
    const char *key;
    char *value;
    st__generator * gen;
    Abc_Command ** ppCommands;
    Abc_Command * pCommands;
    int nCommands, iGroupStart, i, j;
    char * sGroupCur;
    int LenghtMax, nColumns, iCom = 0;
    FILE *backupErr = pAbc->Err;

    // put all commands into one array
    nCommands = st__count( pAbc->tCommands );
    ppCommands = ABC_ALLOC( Abc_Command *, nCommands );
    i = 0;
    st__foreach_item( pAbc->tCommands, gen, &key, &value )
    {
        pCommands = (Abc_Command *)value;
        if ( fPrintAll || pCommands->sName[0] != '_' )
            ppCommands[i++] = pCommands;
    }
    nCommands = i;

    // sort command by group and then by name, alphabetically
    qsort( (void *)ppCommands, nCommands, sizeof(Abc_Command *), 
            (int (*)(const void *, const void *)) CmdCommandPrintCompare );
    assert( CmdCommandPrintCompare( ppCommands, ppCommands + nCommands - 1 ) <= 0 );

    // get the longest command name
    LenghtMax = 0;
    for ( i = 0; i < nCommands; i++ )
        if ( LenghtMax < (int)strlen(ppCommands[i]->sName) )
             LenghtMax = (int)strlen(ppCommands[i]->sName); 
    // get the number of columns
    nColumns = 79 / (LenghtMax + 2);

    // print the starting message 
    fprintf( pAbc->Out, "      Welcome to ABC compiled on %s %s!", __DATE__, __TIME__ );

    // print the command by group
    sGroupCur = NULL;
    iGroupStart = 0;
    pAbc->Err = pAbc->Out;
    for ( i = 0; i < nCommands; i++ )
        if ( sGroupCur && strcmp( sGroupCur, ppCommands[i]->sGroup ) == 0 )
        { // this command belongs to the same group as the previous one
            if ( iCom++ % nColumns == 0 )
                fprintf( pAbc->Out, "\n" ); 
            // print this command
            fprintf( pAbc->Out, " %-*s", LenghtMax, ppCommands[i]->sName );
        }
        else
        { // this command starts the new group of commands
            // start the new group
            if ( fDetails && i != iGroupStart )
            { // print help messages for all commands in the previous groups
                fprintf( pAbc->Out, "\n" );
                for ( j = iGroupStart; j < i; j++ )
                {
                    char *tmp_cmd;
                    fprintf( pAbc->Out, "\n" );
                    // fprintf( pAbc->Out, "--- %s ---\n", ppCommands[j]->sName );
                    tmp_cmd = ABC_ALLOC(char, strlen(ppCommands[j]->sName)+4);
                    (void) sprintf(tmp_cmd, "%s -h", ppCommands[j]->sName);
                    (void) Cmd_CommandExecute( pAbc, tmp_cmd );
                    ABC_FREE(tmp_cmd);
                }
                fprintf( pAbc->Out, "\n" );
                fprintf( pAbc->Out, "   ----------------------------------------------------------------------" );
                iGroupStart = i;
            }
            fprintf( pAbc->Out, "\n" );
            fprintf( pAbc->Out, "\n" );
            fprintf( pAbc->Out, "%s commands:\n", ppCommands[i]->sGroup );
            // print this command
            fprintf( pAbc->Out, " %-*s", LenghtMax, ppCommands[i]->sName );
            // remember current command group
            sGroupCur = ppCommands[i]->sGroup;
            // reset the command counter
            iCom = 1;
        }
    if ( fDetails && i != iGroupStart )
    { // print help messages for all commands in the previous groups
        fprintf( pAbc->Out, "\n" );
        for ( j = iGroupStart; j < i; j++ )
        {
            char *tmp_cmd;
            fprintf( pAbc->Out, "\n" );
            // fprintf( pAbc->Out, "--- %s ---\n", ppCommands[j]->sName );
            tmp_cmd = ABC_ALLOC(char, strlen(ppCommands[j]->sName)+4);
            (void) sprintf(tmp_cmd, "%s -h", ppCommands[j]->sName);
            (void) Cmd_CommandExecute( pAbc, tmp_cmd );
            ABC_FREE(tmp_cmd);
        }
    }
    pAbc->Err = backupErr;
    fprintf( pAbc->Out, "\n" );
    ABC_FREE( ppCommands );
}